

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuPair.c
# Opt level: O3

void Fxu_PairClearStorage(Fxu_Cube *pCube)

{
  int iVar1;
  int iVar2;
  Fxu_Var *pFVar3;
  long lVar4;
  
  pFVar3 = pCube->pVar;
  iVar1 = pFVar3->nCubes;
  if (0 < (long)iVar1) {
    iVar2 = pCube->iCube;
    lVar4 = 0;
    do {
      pFVar3->ppPairs[iVar2][lVar4] = (Fxu_Pair *)0x0;
      pFVar3->ppPairs[lVar4][iVar2] = (Fxu_Pair *)0x0;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return;
}

Assistant:

void Fxu_PairClearStorage( Fxu_Cube * pCube )
{
    Fxu_Var * pVar;
    int i;
    pVar = pCube->pVar;
    for ( i = 0; i < pVar->nCubes; i++ )
    {
        pVar->ppPairs[pCube->iCube][i] = NULL;
        pVar->ppPairs[i][pCube->iCube] = NULL;
    }
}